

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O3

void __thiscall absl::lts_20240722::BadStatusOrAccess::~BadStatusOrAccess(BadStatusOrAccess *this)

{
  ~BadStatusOrAccess(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~BadStatusOrAccess() override = default;